

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decoder.c
# Opt level: O0

ZyanStatus
ZydisDecodeMVEX(ZydisDecoderContext *context,ZydisDecodedInstruction *instruction,ZyanU8 *data)

{
  ZyanU8 *data_local;
  ZydisDecodedInstruction *instruction_local;
  ZydisDecoderContext *context_local;
  
  if (instruction == (ZydisDecodedInstruction *)0x0) {
    __assert_fail("instruction",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                  ,0x274,
                  "ZyanStatus ZydisDecodeMVEX(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZyanU8 *)"
                 );
  }
  if (*data == 'b') {
    if ((uint)(instruction->raw).field_3.evex.V2 != instruction->length - 4) {
      __assert_fail("instruction->raw.mvex.offset == instruction->length - 4",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                    ,0x276,
                    "ZyanStatus ZydisDecodeMVEX(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZyanU8 *)"
                   );
    }
    if (instruction->machine_mode == ZYDIS_MACHINE_MODE_LONG_64) {
      instruction->attributes = instruction->attributes | 0x40;
      (instruction->raw).field_3.rex.W = (ZyanU8)((int)(uint)data[1] >> 7);
      (instruction->raw).field_3.rex.R = (byte)((int)(uint)data[1] >> 6) & 1;
      (instruction->raw).field_3.rex.X = (byte)((int)(uint)data[1] >> 5) & 1;
      (instruction->raw).field_3.rex.B = (byte)((int)(uint)data[1] >> 4) & 1;
      (instruction->raw).field_3.rex.offset = data[1] & 0xf;
      if ((instruction->raw).field_3.rex.offset < 4) {
        (instruction->raw).field_3.xop.vvvv = (ZyanU8)((int)(uint)data[2] >> 7);
        (instruction->raw).field_3.xop.L = (byte)((int)(uint)data[2] >> 3) & 0xf;
        if (((int)(uint)data[2] >> 2 & 1U) != 0) {
          __assert_fail("((data[2] >> 2) & 0x01) == 0x00",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                        ,0x28e,
                        "ZyanStatus ZydisDecodeMVEX(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZyanU8 *)"
                       );
        }
        (instruction->raw).field_3.xop.pp = data[2] & 3;
        (instruction->raw).field_3.xop.offset = (ZyanU8)((int)(uint)data[3] >> 7);
        (instruction->raw).field_3.vex.size = (byte)((int)(uint)data[3] >> 4) & 7;
        (instruction->raw).field_3.evex.L = (byte)((int)(uint)data[3] >> 3) & 1;
        (instruction->raw).field_3.evex.b = data[3] & 7;
        (context->vector_unified).W = (instruction->raw).field_3.xop.vvvv;
        (context->vector_unified).R = ((instruction->raw).field_3.rex.W ^ 0xff) & 1;
        (context->vector_unified).X = ((instruction->raw).field_3.rex.R ^ 0xff) & 1;
        (context->vector_unified).B = ((instruction->raw).field_3.rex.X ^ 0xff) & 1;
        (context->vector_unified).R2 = ((instruction->raw).field_3.rex.B ^ 0xff) & 1;
        (context->vector_unified).V2 = ((instruction->raw).field_3.evex.L ^ 0xff) & 1;
        (context->vector_unified).LL = '\x02';
        (context->vector_unified).vvvv = ((instruction->raw).field_3.xop.L ^ 0xff) & 0xf;
        (context->vector_unified).mask = (instruction->raw).field_3.evex.b;
        context_local._4_4_ = 0x100000;
      }
      else {
        context_local._4_4_ = 0x80200007;
      }
    }
    else {
      context_local._4_4_ = 0x80200001;
    }
    return context_local._4_4_;
  }
  __assert_fail("data[0] == 0x62",
                "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c",
                0x275,
                "ZyanStatus ZydisDecodeMVEX(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZyanU8 *)"
               );
}

Assistant:

static ZyanStatus ZydisDecodeMVEX(ZydisDecoderContext* context,
    ZydisDecodedInstruction* instruction, const ZyanU8 data[4])
{
    ZYAN_ASSERT(instruction);
    ZYAN_ASSERT(data[0] == 0x62);
    ZYAN_ASSERT(instruction->raw.mvex.offset == instruction->length - 4);

    if (instruction->machine_mode != ZYDIS_MACHINE_MODE_LONG_64)
    {
        // MVEX is only valid in 64-bit mode
        return ZYDIS_STATUS_DECODING_ERROR;
    }

    instruction->attributes |= ZYDIS_ATTRIB_HAS_MVEX;
    instruction->raw.mvex.R    = (data[1] >> 7) & 0x01;
    instruction->raw.mvex.X    = (data[1] >> 6) & 0x01;
    instruction->raw.mvex.B    = (data[1] >> 5) & 0x01;
    instruction->raw.mvex.R2   = (data[1] >> 4) & 0x01;
    instruction->raw.mvex.mmmm = (data[1] >> 0) & 0x0F;

    if (instruction->raw.mvex.mmmm > 0x03)
    {
        // Invalid according to the intel documentation
        return ZYDIS_STATUS_INVALID_MAP;
    }

    instruction->raw.mvex.W    = (data[2] >> 7) & 0x01;
    instruction->raw.mvex.vvvv = (data[2] >> 3) & 0x0F;

    ZYAN_ASSERT(((data[2] >> 2) & 0x01) == 0x00);

    instruction->raw.mvex.pp   = (data[2] >> 0) & 0x03;
    instruction->raw.mvex.E    = (data[3] >> 7) & 0x01;
    instruction->raw.mvex.SSS  = (data[3] >> 4) & 0x07;
    instruction->raw.mvex.V2   = (data[3] >> 3) & 0x01;
    instruction->raw.mvex.kkk  = (data[3] >> 0) & 0x07;

    // Update internal fields
    context->vector_unified.W    = instruction->raw.mvex.W;
    context->vector_unified.R    = 0x01 & ~instruction->raw.mvex.R;
    context->vector_unified.X    = 0x01 & ~instruction->raw.mvex.X;
    context->vector_unified.B    = 0x01 & ~instruction->raw.mvex.B;
    context->vector_unified.R2   = 0x01 & ~instruction->raw.mvex.R2;
    context->vector_unified.V2   = 0x01 & ~instruction->raw.mvex.V2;
    context->vector_unified.LL   = 2;
    context->vector_unified.vvvv = 0x0F & ~instruction->raw.mvex.vvvv;
    context->vector_unified.mask = instruction->raw.mvex.kkk;

    return ZYAN_STATUS_SUCCESS;
}